

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O3

void Gia_IsoSimulate(Gia_IsoMan_t *p,int Iter)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  Gia_Man_t *pGVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *pVVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  uint *puVar22;
  uint uVar14;
  
  pGVar3 = p->pGia;
  pGVar4 = pGVar3->pObjs;
  pGVar4->Value = pGVar4->Value + 0x1b47586d;
  uVar11 = pGVar3->nRegs;
  uVar8 = (ulong)uVar11;
  pVVar5 = pGVar3->vCis;
  uVar2 = pVVar5->nSize;
  uVar21 = uVar2 - uVar11;
  if (uVar21 != 0 && (int)uVar11 <= (int)uVar2) {
    uVar16 = 0;
    uVar19 = 0;
    if (0 < (int)uVar2) {
      uVar19 = (ulong)uVar2;
    }
    do {
      if (uVar19 == uVar16) goto LAB_0071d796;
      iVar9 = pVVar5->pArray[uVar16];
      if (((long)iVar9 < 0) || (pGVar3->nObjs <= iVar9)) goto LAB_0071d777;
      pGVar4[iVar9].Value = pGVar4[iVar9].Value + 0xfbea205c;
      uVar16 = uVar16 + 1;
    } while (uVar21 != uVar16);
  }
  if ((Iter == 0) && (uVar16 = uVar8, uVar10 = uVar21, 0 < (int)uVar11)) {
    do {
      if (((int)uVar10 < 0) || ((int)uVar2 <= (int)uVar10)) goto LAB_0071d796;
      iVar9 = pVVar5->pArray[uVar10];
      if (((long)iVar9 < 0) || (uVar18 = pGVar3->nObjs, (int)uVar18 <= iVar9)) goto LAB_0071d777;
      pGVar4[iVar9].Value = pGVar4[iVar9].Value + 0x22924fcd;
      uVar16 = uVar16 - 1;
      uVar10 = uVar10 + 1;
    } while (uVar16 != 0);
  }
  else {
    uVar18 = pGVar3->nObjs;
    if ((int)uVar18 < 1) goto LAB_0071d643;
  }
  uVar16 = (ulong)uVar18;
  puVar22 = &pGVar4->Value;
  lVar20 = 0;
  do {
    uVar19 = *(ulong *)(puVar22 + -2);
    if ((uVar19 & 0x1fffffff) != 0x1fffffff && -1 < (int)(uint)uVar19) {
      lVar17 = (long)((ulong)((uint)uVar19 & 0x1fffffff) * -0x100000000 + lVar20) >> 0x20;
      if (Iter == 0) {
        uVar10 = p->pLevels[lVar17];
        if ((int)uVar10 < 0) goto LAB_0071d7b5;
LAB_0071d584:
        iVar9 = (uVar10 + 1) * s_256Primes[((uint)(uVar19 >> 0x1d) & 1) + (uVar10 & 0x7f) * 2];
      }
      else {
        uVar10 = p->pUniques[lVar17];
        if (0 < (int)uVar10) goto LAB_0071d584;
        iVar9 = 0;
      }
      uVar10 = iVar9 + *(int *)((long)puVar22 + (ulong)(uint)((int)(uVar19 & 0x1fffffff) << 2) * -3)
               + *puVar22;
      uVar14 = (uint)(uVar19 >> 0x20);
      uVar13 = uVar14 & 0x1fffffff;
      lVar17 = (long)((ulong)uVar13 * -0x100000000 + lVar20) >> 0x20;
      *puVar22 = uVar10;
      if (Iter == 0) {
        uVar15 = p->pLevels[lVar17];
        if ((int)uVar15 < 0) goto LAB_0071d7b5;
LAB_0071d60c:
        iVar9 = (uVar15 + 1) * s_256Primes[(uVar14 >> 0x1d & 1) + (uVar15 & 0x7f) * 2];
      }
      else {
        uVar15 = p->pUniques[lVar17];
        if (0 < (int)uVar15) goto LAB_0071d60c;
        iVar9 = 0;
      }
      *puVar22 = *(int *)((long)puVar22 + (ulong)(uVar13 * 4) * -3) + uVar10 + iVar9;
    }
    lVar20 = lVar20 + 0x100000000;
    puVar22 = puVar22 + 3;
    uVar16 = uVar16 - 1;
  } while (uVar16 != 0);
LAB_0071d643:
  pVVar6 = pGVar3->vCos;
  iVar9 = pVVar6->nSize;
  if (0 < (long)iVar9) {
    piVar7 = pVVar6->pArray;
    lVar20 = 0;
    do {
      iVar12 = piVar7[lVar20];
      if (((long)iVar12 < 0) || ((int)uVar18 <= iVar12)) goto LAB_0071d777;
      pGVar1 = pGVar4 + iVar12;
      uVar10 = (uint)*(undefined8 *)pGVar1 & 0x1fffffff;
      iVar12 = iVar12 - uVar10;
      if (Iter == 0) {
        uVar13 = p->pLevels[iVar12];
        if ((int)uVar13 < 0) {
LAB_0071d7b5:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
LAB_0071d6c8:
        iVar12 = (uVar13 + 1) *
                 s_256Primes[((uint)*(undefined8 *)pGVar1 >> 0x1d & 1) + (uVar13 & 0x7f) * 2];
      }
      else {
        uVar13 = p->pUniques[iVar12];
        if (0 < (int)uVar13) goto LAB_0071d6c8;
        iVar12 = 0;
      }
      pGVar1->Value = pGVar1->Value + iVar12 + pGVar1[-(ulong)uVar10].Value;
      lVar20 = lVar20 + 1;
    } while (iVar9 != lVar20);
  }
  if (0 < (int)uVar11) {
    uVar11 = iVar9 - uVar11;
    uVar10 = uVar21;
    do {
      if (((int)uVar11 < 0) || (iVar9 <= (int)uVar11)) {
LAB_0071d796:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar12 = pVVar6->pArray[uVar11];
      if (((long)iVar12 < 0) || ((int)uVar18 <= iVar12)) {
LAB_0071d777:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (((int)uVar21 < 0) || ((int)uVar2 <= (int)uVar10)) goto LAB_0071d796;
      uVar13 = pVVar5->pArray[uVar10];
      if (((long)(int)uVar13 < 0) || (uVar18 <= uVar13)) goto LAB_0071d777;
      pGVar4[(int)uVar13].Value = pGVar4[(int)uVar13].Value + pGVar4[iVar12].Value;
      uVar10 = uVar10 + 1;
      uVar11 = uVar11 + 1;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  return;
}

Assistant:

void Gia_IsoSimulate( Gia_IsoMan_t * p, int Iter )
{
    Gia_Obj_t * pObj, * pObjF;
    int i, iObj;
    // initialize constant, inputs, and flops in the first frame
    Gia_ManConst0(p->pGia)->Value += s_256Primes[ISO_MASK];
    Gia_ManForEachPi( p->pGia, pObj, i )
        pObj->Value += s_256Primes[ISO_MASK-1];
    if ( Iter == 0 )
        Gia_ManForEachRo( p->pGia, pObj, i )
            pObj->Value += s_256Primes[ISO_MASK-2];
    // simulate nodes
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        pObj->Value += Gia_ObjFanin0(pObj)->Value + Gia_IsoUpdate(p, Iter, Gia_ObjFaninId0(pObj, i), Gia_ObjFaninC0(pObj));
        pObj->Value += Gia_ObjFanin1(pObj)->Value + Gia_IsoUpdate(p, Iter, Gia_ObjFaninId1(pObj, i), Gia_ObjFaninC1(pObj));
    }
    // simulate COs
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        iObj = Gia_ObjId(p->pGia, pObj);
        pObj->Value += Gia_ObjFanin0(pObj)->Value + Gia_IsoUpdate(p, Iter, Gia_ObjFaninId0(pObj, iObj), Gia_ObjFaninC0(pObj));
    }
    // transfer flop values
    Gia_ManForEachRiRo( p->pGia, pObjF, pObj, i )
        pObj->Value += pObjF->Value;
}